

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

void restore_monsters(void)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  monster *mon;
  long lVar5;
  
  iVar2 = turn - cave->turn;
  wVar3 = cave_monster_max(cave);
  if (L'\x01' < wVar3) {
    do {
      mon = cave_monster(cave,wVar3 + L'\xffffffff');
      regen_monster(mon,iVar2 / 100);
      wVar4 = turn_energy((uint)mon->mspeed);
      wVar4 = (wVar4 * iVar2) / (int)(uint)z_info->move_energy;
      if (L'\0' < wVar4) {
        lVar5 = 0;
        do {
          if (mon->m_timed[lVar5] != 0) {
            mon_dec_timed(mon,(wchar_t)lVar5,wVar4,L'\0');
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 10);
      }
      bVar1 = L'\x02' < wVar3;
      wVar3 = wVar3 + L'\xffffffff';
    } while (bVar1);
  }
  return;
}

Assistant:

void restore_monsters(void)
{
	int i;
	struct monster *mon;

	/* Get the number of turns that have passed */
	int num_turns = turn - cave->turn;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		int status, status_red;

		/* Access the monster */
		mon = cave_monster(cave, i);

		/* Regenerate */
		regen_monster(mon, num_turns / 100);

		/* Handle timed effects */
		status_red = num_turns * turn_energy(mon->mspeed) / z_info->move_energy;
		if (status_red > 0) {
			for (status = 0; status < MON_TMD_MAX; status++) {
				if (mon->m_timed[status]) {
					mon_dec_timed(mon, status, status_red, 0);
				}
			}
		}
	}
}